

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpTool.hpp
# Opt level: O0

void __thiscall
helptool::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this)

{
  ostream *poVar1;
  rep rVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  duration<long,_std::ratio<1L,_1000L>_> local_18;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> duration;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this_local;
  
  duration.__r = (rep)this;
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20.__r = (rep)std::chrono::operator-(&local_28,&this->m_t_);
  local_18.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_20);
  poVar1 = std::operator<<((ostream *)&std::cout,"The execution time about ");
  poVar1 = std::operator<<(poVar1,(string *)&this->content_);
  poVar1 = std::operator<<(poVar1," is: ");
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_18);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2 / (long)this->times_);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_unit_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&this->content_);
  std::__cxx11::string::~string((string *)&this->m_unit_);
  return;
}

Assistant:

~Timer()
    {
        auto duration = std::chrono::duration_cast<T>(std::chrono::high_resolution_clock::now()-m_t_);
        PRINTN("The execution time about "<<  content_ <<" is: " << duration.count()/times_ << " " << m_unit_);
    }